

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

uchar * mcmhalo(mcmcx1def *ctx)

{
  int iVar1;
  uchar *puVar2;
  size_t sVar3;
  long in_RDI;
  errdef fr_;
  int err;
  uchar *chunk;
  char *comment;
  undefined8 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb4;
  __jmp_buf_tag _Stack_e8;
  uchar *local_18;
  long local_10;
  uchar *local_8;
  
  if (*(ulong *)(in_RDI + 0x60) < 0x8000) {
    local_8 = (uchar *)0x0;
  }
  else {
    local_10 = in_RDI;
    iVar1 = _setjmp(&_Stack_e8);
    if (iVar1 == 0) {
      sVar3 = **(size_t **)(local_10 + 8);
      **(long **)(local_10 + 8) = (long)&stack0xfffffffffffffea8;
      comment = *(char **)(local_10 + 8);
      osrndsz(2);
      puVar2 = mchalo((errcxdef *)CONCAT44(in_stack_fffffffffffffeb4,iVar1),sVar3,comment);
      **(size_t **)(local_10 + 8) = sVar3;
      *(long *)(local_10 + 0x60) = *(long *)(local_10 + 0x60) + -0x8000;
      *(undefined8 *)puVar2 = *(undefined8 *)(local_10 + 0x10);
      *(uchar **)(local_10 + 0x10) = puVar2;
      local_18 = puVar2;
      sVar3 = osrndsz(0x8008);
      (puVar2 + sVar3)[0] = 0xff;
      (puVar2 + sVar3)[1] = 0xff;
      local_8 = local_18 + 8;
    }
    else {
      **(undefined8 **)(local_10 + 8) = in_stack_fffffffffffffea8;
      *(undefined8 *)(local_10 + 0x60) = 0;
      local_8 = (uchar *)0x0;
    }
  }
  return local_8;
}

Assistant:

static uchar *mcmhalo(mcmcx1def *ctx)
{
    uchar  *chunk;
    int     err;
#   define  size (MCMCHUNK + sizeof(mcmhdef) + 2*osrndsz(sizeof(mcmon)))

    VARUSED(err);

    MCMGLBCTX(ctx);

    if (ctx->mcmcxmax < MCMCHUNK) return((uchar *)0);

    ERRBEGIN(ctx->mcmcxerr)
        chunk = mchalo(ctx->mcmcxerr, size, "mcmhalo");
    ERRCATCH(ctx->mcmcxerr, err)
        ctx->mcmcxmax = 0;      /* remember we can't allocate anything more */
        return((uchar *)0);                             /* return no memory */
    ERREND(ctx->mcmcxerr)

    ctx->mcmcxmax -= MCMCHUNK;
    
    /* link into heap chain */
    ((mcmhdef *)chunk)->mcmhnxt = ctx->mcmcxhpch;
    ctx->mcmcxhpch = (mcmhdef *)chunk;
/*@@@@*/
    *(mcmon *)(chunk + osrndsz(sizeof(mcmhdef) + MCMCHUNK)) = MCMONINV;
    return(chunk + sizeof(mcmhdef));

#   undef size
}